

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O0

int N_VConstrMask_MultiFab(N_Vector a,N_Vector x,N_Vector m)

{
  ulong uVar1;
  undefined1 *puVar2;
  bool bVar3;
  MultiFab **ppMVar4;
  N_Vector in_RDX;
  N_Vector in_RSI;
  N_Vector in_RDI;
  Array4<double> *m_fab;
  Array4<double> *a_fab;
  Array4<double> *x_fab;
  Box *bx;
  MFIter mfi;
  Real temp;
  sunindextype ncomp;
  MultiFab *mf_m;
  MultiFab *mf_a;
  MultiFab *mf_x;
  MFIter *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  MFIter *in_stack_fffffffffffffda0;
  uchar in_stack_fffffffffffffdb7;
  FabArrayBase *in_stack_fffffffffffffdb8;
  MFIter *in_stack_fffffffffffffdc0;
  anon_class_192_3_365a8ee8 *in_stack_fffffffffffffdd8;
  undefined1 auStack_220 [4];
  int in_stack_fffffffffffffde4;
  Box *in_stack_fffffffffffffde8;
  undefined1 auStack_1e0 [64];
  undefined1 local_1a0 [64];
  undefined1 *local_160;
  undefined1 local_158 [71];
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  MultiFab *in_stack_fffffffffffffef8;
  undefined1 local_c4 [36];
  MFIter local_a0;
  double local_40;
  int local_34;
  MultiFab *local_30;
  MultiFab *local_28;
  FabArrayBase *local_20;
  N_Vector local_18;
  N_Vector local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  ppMVar4 = amrex::sundials::getMFptr(in_RSI);
  local_20 = (FabArrayBase *)*ppMVar4;
  ppMVar4 = amrex::sundials::getMFptr(local_8);
  local_28 = *ppMVar4;
  ppMVar4 = amrex::sundials::getMFptr(local_18);
  local_30 = *ppMVar4;
  local_34 = amrex::FabArrayBase::nComp(local_20);
  local_40 = 0.0;
  amrex::MFIter::MFIter
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb7);
  while (bVar3 = amrex::MFIter::isValid(&local_a0), bVar3) {
    amrex::MFIter::validbox(in_stack_fffffffffffffda0);
    local_c4._28_8_ = local_c4;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               in_stack_fffffffffffffd90);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               in_stack_fffffffffffffd90);
    unique0x00005300 = local_158;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               in_stack_fffffffffffffd90);
    local_160 = local_1a0;
    in_stack_fffffffffffffd90 = (MFIter *)local_c4._28_8_;
    in_stack_fffffffffffffd9c = local_34;
    memcpy(&stack0xfffffffffffffda0,local_160,0x3c);
    memcpy(auStack_220,stack0xfffffffffffffee8,0x3c);
    memcpy(auStack_1e0,&stack0xfffffffffffffef0,0x3c);
    amrex::ParallelFor<int,N_VConstrMask_MultiFab::__0,void>
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,in_stack_fffffffffffffdd8);
    amrex::MFIter::operator++(&local_a0);
  }
  amrex::MFIter::~MFIter(in_stack_fffffffffffffd90);
  puVar2 = stack0xfffffffffffffee8;
  uVar1 = (ulong)stack0xfffffffffffffee8 >> 0x38;
  bVar3 = SUB81(uVar1,0);
  unique0x100002b4 = puVar2;
  local_40 = amrex::MultiFab::norm1
                       (in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                        in_stack_fffffffffffffef0,bVar3);
  amrex::ParallelDescriptor::ReduceRealMax<double>(&local_40);
  return (uint)(local_40 != 1.0);
}

Assistant:

int N_VConstrMask_MultiFab(N_Vector a, N_Vector x, N_Vector m)
{
    using namespace amrex;

    amrex::MultiFab *mf_x = amrex::sundials::getMFptr(x);
    amrex::MultiFab *mf_a = amrex::sundials::getMFptr(a);
    amrex::MultiFab *mf_m = amrex::sundials::getMFptr(m);
    sunindextype ncomp = mf_x->nComp();

    // ghost cells not included
    amrex::Real temp = amrex::Real(0.0);
    for (MFIter mfi(*mf_x); mfi.isValid(); ++mfi) {
        const amrex::Box& bx = mfi.validbox();
        Array4<Real> const& x_fab = mf_x->array(mfi);
        Array4<Real> const& a_fab = mf_a->array(mfi);
        Array4<Real> const& m_fab = mf_a->array(mfi);
        //Changing continue to if check, temp calculation should be changed to reduction
        amrex::ParallelFor(bx, ncomp,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int c) noexcept
            {
                m_fab(i,j,k,c) = amrex::Real(0.0);

                /* Continue if no constraints were set for the variable */
                if (a_fab(i,j,k,c) != amrex::Real(0.0)) {

                    /* Check if a set constraint has been violated */
                    amrex::Real a, x;
                    a = a_fab(i,j,k,c);
                    x = x_fab(i,j,k,c);
                    int test = (SUNRabs(a) > amrex::Real(1.5) && x*a <= amrex::Real(0.0)) ||
                        (SUNRabs(a) > amrex::Real(0.5)   && x*a <  amrex::Real(0.0));
                    if (test) {
                        m_fab(i,j,k,c) = amrex::Real(1.0);
                    }
                }
            });
    }

    temp = mf_m->norm1();
    /* Return false if any constraint was violated */
    amrex::ParallelDescriptor::ReduceRealMax(temp);

    return (temp == amrex::Real(1.0)) ? SUNFALSE : SUNTRUE;
}